

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O2

Gia_Man_t * Gia_ManVerifyCexAndMove(Gia_Man_t *pGia,Abc_Cex_t *p)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  Gia_ManCleanMark0(pGia);
  for (uVar10 = 0; (int)uVar10 < pGia->nRegs; uVar10 = uVar10 + 1) {
    pGVar4 = Gia_ManCi(pGia,(pGia->vCis->nSize - pGia->nRegs) + uVar10);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar4 =
         *(ulong *)pGVar4 & 0xffffffffbfffffff |
         (ulong)(((uint)(&p[1].iPo)[uVar10 >> 5] >> ((byte)uVar10 & 0x1f) & 1) << 0x1e);
  }
  for (iVar3 = 0; iVar3 <= p->iFrame; iVar3 = iVar3 + 1) {
    for (iVar8 = 0; uVar1 = uVar10 + iVar8, iVar8 < pGia->vCis->nSize - pGia->nRegs;
        iVar8 = iVar8 + 1) {
      pGVar4 = Gia_ManCi(pGia,iVar8);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar4 =
           *(ulong *)pGVar4 & 0xffffffffbfffffff |
           (ulong)(((uint)(&p[1].iPo)[(int)uVar1 >> 5] >> ((byte)uVar1 & 0x1f) & 1) << 0x1e);
    }
    for (iVar9 = 0; iVar9 < pGia->nObjs; iVar9 = iVar9 + 1) {
      pGVar4 = Gia_ManObj(pGia,iVar9);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar2 = *(ulong *)pGVar4;
      if ((uVar2 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar2) {
        uVar7 = (uint)(uVar2 >> 0x20);
        *(ulong *)pGVar4 =
             uVar2 & 0xffffffff3fffffff |
             (ulong)(((uVar7 >> 0x1d ^ *(uint *)(pGVar4 + -(ulong)(uVar7 & 0x1fffffff)) >> 0x1e) &
                      ((uint)(uVar2 >> 0x1d) & 7 ^ *(uint *)(pGVar4 + -(uVar2 & 0x1fffffff)) >> 0x1e
                      ) & 1) << 0x1e);
      }
    }
    for (iVar9 = 0; iVar9 < pGia->vCos->nSize; iVar9 = iVar9 + 1) {
      pGVar4 = Gia_ManCo(pGia,iVar9);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar7 = (uint)*(ulong *)pGVar4;
      *(ulong *)pGVar4 =
           *(ulong *)pGVar4 & 0xffffffffbfffffff |
           (ulong)((uVar7 * 2 ^ *(uint *)(pGVar4 + -(ulong)(uVar7 & 0x1fffffff))) & 0x40000000);
    }
    if (iVar3 == p->iFrame) {
      uVar10 = uVar10 + iVar8;
      break;
    }
    for (iVar8 = 0; iVar8 < pGia->nRegs; iVar8 = iVar8 + 1) {
      pGVar4 = Gia_ManCo(pGia,(pGia->vCos->nSize - pGia->nRegs) + iVar8);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar5 = Gia_ManCi(pGia,(pGia->vCis->nSize - pGia->nRegs) + iVar8);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar5 =
           *(ulong *)pGVar5 & 0xffffffffbfffffff | (ulong)((uint)*(undefined8 *)pGVar4 & 0x40000000)
      ;
    }
    uVar10 = uVar1;
  }
  if (uVar10 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                  ,0x84,"Gia_Man_t *Gia_ManVerifyCexAndMove(Gia_Man_t *, Abc_Cex_t *)");
  }
  pGVar4 = Gia_ManPo(pGia,p->iPo);
  if ((pGVar4->field_0x3 & 0x40) == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                  ,0x86,"Gia_Man_t *Gia_ManVerifyCexAndMove(Gia_Man_t *, Abc_Cex_t *)");
  }
  for (iVar3 = 0; iVar3 < pGia->vCis->nSize - pGia->nRegs; iVar3 = iVar3 + 1) {
    pGVar4 = Gia_ManCi(pGia,iVar3);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pGVar4->field_0x3 = pGVar4->field_0x3 & 0xbf;
  }
  for (iVar3 = 0; iVar3 < pGia->vCos->nSize - pGia->nRegs; iVar3 = iVar3 + 1) {
    pGVar4 = Gia_ManCo(pGia,iVar3);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pGVar4->field_0x3 = pGVar4->field_0x3 & 0xbf;
  }
  for (iVar3 = 0; iVar3 < pGia->nRegs; iVar3 = iVar3 + 1) {
    pGVar4 = Gia_ManCo(pGia,(pGia->vCos->nSize - pGia->nRegs) + iVar3);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pGVar5 = Gia_ManCi(pGia,(pGia->vCis->nSize - pGia->nRegs) + iVar3);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar4 =
         *(ulong *)pGVar4 & 0xffffffffbfffffff | (ulong)((uint)*(undefined8 *)pGVar5 & 0x40000000);
  }
  pGVar6 = Gia_ManDupWithInit(pGia);
  Gia_ManCleanMark0(pGia);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManVerifyCexAndMove( Gia_Man_t * pGia, Abc_Cex_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    Gia_ManCleanMark0(pGia);
    Gia_ManForEachRo( pGia, pObj, i )
        pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pGia, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pGia, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pGia, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( iBit == p->nBits );
    RetValue = Gia_ManPo(pGia, p->iPo)->fMark0;
    assert( RetValue );
    // set PI/PO values to zero and transfer RO values to RI
    Gia_ManForEachPi( pGia, pObj, k )
        pObj->fMark0 = 0;
    Gia_ManForEachPo( pGia, pObj, k )
        pObj->fMark0 = 0;
    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, k )
        pObjRi->fMark0 = pObjRo->fMark0;
    // duplicate assuming CI/CO marks are set correctly
    pNew = Gia_ManDupWithInit( pGia );
    Gia_ManCleanMark0(pGia);
    return pNew;
}